

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O3

void __thiscall QWidgetAction::setDefaultWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  char cVar4;
  undefined8 uVar5;
  QWidget *pQVar6;
  
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(lVar1 + 0x1a8);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
    pQVar6 = (QWidget *)0x0;
  }
  else {
    pQVar6 = *(QWidget **)(lVar1 + 0x1b0);
  }
  if ((pQVar6 != widget) && ((*(byte *)(lVar1 + 0x1d0) & 1) == 0)) {
    if ((lVar2 != 0) && ((*(int *)(lVar2 + 4) != 0 && (*(long **)(lVar1 + 0x1b0) != (long *)0x0))))
    {
      (**(code **)(**(long **)(lVar1 + 0x1b0) + 0x20))();
    }
    if (widget == (QWidget *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
    }
    piVar3 = *(int **)(lVar1 + 0x1a8);
    *(undefined8 *)(lVar1 + 0x1a8) = uVar5;
    *(QWidget **)(lVar1 + 0x1b0) = widget;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
    if (widget != (QWidget *)0x0) {
      QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
      QAction::setVisible(SUB81(this,0));
      QWidget::hide(*(QWidget **)(lVar1 + 0x1b0));
      QWidget::setParent(*(QWidget **)(lVar1 + 0x1b0),(QWidget *)0x0);
      *(byte *)(lVar1 + 0x1d0) = *(byte *)(lVar1 + 0x1d0) & 0xfe;
      cVar4 = QAction::isEnabled();
      if (cVar4 == '\0') {
        QWidget::setEnabled(*(QWidget **)(lVar1 + 0x1b0),false);
        return;
      }
    }
  }
  return;
}

Assistant:

void QWidgetAction::setDefaultWidget(QWidget *widget)
{
    Q_D(QWidgetAction);
    if (widget == d->defaultWidget || d->defaultWidgetInUse)
        return;
    delete d->defaultWidget;
    d->defaultWidget = widget;
    if (!widget)
        return;

    setVisible(!QWidgetPrivate::get(widget)->isExplicitlyHidden());
    d->defaultWidget->hide();
    d->defaultWidget->setParent(nullptr);
    d->defaultWidgetInUse = false;
    if (!isEnabled())
        d->defaultWidget->setEnabled(false);
}